

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_lifecycle_hooks.cpp
# Opt level: O0

void __thiscall
TestClientContextState::TransactionRollback
          (TestClientContextState *this,MetaTransaction *transaction,ClientContext *context,
          optional_ptr<duckdb::ErrorData,_true> error)

{
  bool bVar1;
  ErrorData *pEVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  value_type *in_RDI;
  optional_ptr<duckdb::ErrorData,_true> *in_stack_ffffffffffffffd0;
  optional_ptr local_8 [8];
  
  bVar1 = duckdb::optional_ptr::operator_cast_to_bool(local_8);
  if (bVar1) {
    pEVar2 = duckdb::optional_ptr<duckdb::ErrorData,_true>::operator->(in_stack_ffffffffffffffd0);
    bVar1 = duckdb::ErrorData::HasError(pEVar2);
    if (bVar1) {
      pEVar2 = duckdb::optional_ptr<duckdb::ErrorData,_true>::operator->
                         ((optional_ptr<duckdb::ErrorData,_true> *)(in_RDI + 1));
      duckdb::ErrorData::Message_abi_cxx11_(pEVar2);
      Catch::clara::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(in_RDX,in_RDI);
    }
  }
  return;
}

Assistant:

void TransactionRollback(MetaTransaction &transaction, ClientContext &context,
	                         optional_ptr<ErrorData> error) override {
		if (error && error->HasError()) {
			transaction_errors.push_back(error->Message());
		}
	}